

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3_errmsg16(sqlite3 *db)

{
  int iVar1;
  char *zFormat;
  ulong uVar2;
  u16 *puVar3;
  
  if (db == (sqlite3 *)0x0) {
    puVar3 = sqlite3_errmsg16::outOfMem;
  }
  else {
    iVar1 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar1 == 0) {
      puVar3 = sqlite3_errmsg16::misuse;
    }
    else {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      if (db->mallocFailed == '\0') {
        puVar3 = (u16 *)sqlite3ValueText(db->pErr,'\x02');
        if (puVar3 == (u16 *)0x0) {
          uVar2 = (ulong)(uint)db->errCode;
          if (uVar2 == 0x204) {
            zFormat = "abort due to ROLLBACK";
          }
          else {
            zFormat = "unknown error";
            if (((uint)(uVar2 & 0xff) < 0x1b) && ((0x1410004UL >> (uVar2 & 0x3f) & 1) == 0)) {
              zFormat = *(char **)(sqlite3ErrStr_aMsg + (uVar2 & 0xff) * 8);
            }
          }
          sqlite3ErrorWithMsg(db,db->errCode,zFormat);
          puVar3 = (u16 *)sqlite3ValueText(db->pErr,'\x02');
        }
        if ((db->mallocFailed != '\0') && (db->nVdbeExec == 0)) {
          db->mallocFailed = '\0';
          (db->u1).isInterrupted = 0;
          (db->lookaside).bDisable = (db->lookaside).bDisable - 1;
        }
      }
      else {
        puVar3 = sqlite3_errmsg16::outOfMem;
      }
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
    }
  }
  return puVar3;
}

Assistant:

SQLITE_API const void *sqlite3_errmsg16(sqlite3 *db){
  static const u16 outOfMem[] = {
    'o', 'u', 't', ' ', 'o', 'f', ' ', 'm', 'e', 'm', 'o', 'r', 'y', 0
  };
  static const u16 misuse[] = {
    'b', 'a', 'd', ' ', 'p', 'a', 'r', 'a', 'm', 'e', 't', 'e', 'r', ' ',
    'o', 'r', ' ', 'o', 't', 'h', 'e', 'r', ' ', 'A', 'P', 'I', ' ',
    'm', 'i', 's', 'u', 's', 'e', 0
  };

  const void *z;
  if( !db ){
    return (void *)outOfMem;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return (void *)misuse;
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = (void *)outOfMem;
  }else{
    z = sqlite3_value_text16(db->pErr);
    if( z==0 ){
      sqlite3ErrorWithMsg(db, db->errCode, sqlite3ErrStr(db->errCode));
      z = sqlite3_value_text16(db->pErr);
    }
    /* A malloc() may have failed within the call to sqlite3_value_text16()
    ** above. If this is the case, then the db->mallocFailed flag needs to
    ** be cleared before returning. Do this directly, instead of via
    ** sqlite3ApiExit(), to avoid setting the database handle error message.
    */
    sqlite3OomClear(db);
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}